

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_append_entries(raft_server *this,req_msg *req)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  log_val_type lVar4;
  int32 iVar5;
  ulong uVar6;
  element_type *peVar7;
  ulong uVar8;
  element_type *peVar9;
  element_type *peVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *pvVar11;
  size_type sVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  buffer *pbVar13;
  element_type *this_00;
  undefined4 extraout_var_04;
  element_type *peVar14;
  element_type *peVar15;
  element_type *peVar16;
  uptr<log_entry_cookie> *puVar17;
  element_type *this_01;
  socklen_t *__addr_len;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  long in_RSI;
  element_type *in_RDI;
  bool bVar19;
  ptr<resp_msg> pVar20;
  ulong idx_for_entry;
  ptr<log_entry> entry_1;
  ptr<log_entry> entry;
  ptr<log_entry> old_entry;
  size_t log_idx;
  ulong idx;
  bool log_okay;
  ptr<resp_msg> *resp;
  shared_ptr<cornerstone::log_entry> *in_stack_fffffffffffffa48;
  strfmt<200> *in_stack_fffffffffffffa50;
  int *in_stack_fffffffffffffa58;
  log_entry *in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  raft_server *in_stack_fffffffffffffa70;
  raft_server *in_stack_fffffffffffffa80;
  buffer *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  log_val_type in_stack_fffffffffffffa94;
  ulong in_stack_fffffffffffffb40;
  raft_server *in_stack_fffffffffffffb48;
  bool local_3b9;
  bool local_3a1;
  allocator<char> local_349;
  strfmt<100> local_348;
  string local_2d8 [32];
  raft_server *local_2b8;
  undefined1 local_2b0 [23];
  allocator<char> local_299;
  strfmt<100> local_298;
  string local_228 [32];
  undefined1 local_208 [23];
  allocator<char> local_1f1;
  strfmt<100> local_1f0;
  string local_180 [32];
  undefined1 local_160 [16];
  ulong local_150;
  ulong local_148;
  bool local_139;
  undefined8 local_138;
  int32 local_130;
  undefined4 local_12c;
  ulong local_128;
  undefined1 local_11d;
  allocator<char> local_109;
  strfmt<200> local_108;
  string local_38 [32];
  req_msg *local_18;
  
  local_18 = in_RDX;
  uVar6 = msg_base::get_term(&in_RDX->super_msg_base);
  peVar7 = std::
           __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d4b9b);
  uVar8 = srv_state::get_term(peVar7);
  if (uVar6 == uVar8) {
    if (*(int *)(in_RSI + 0x128) == 2) {
      become_follower(in_stack_fffffffffffffa80);
    }
    else {
      if (*(int *)(in_RSI + 0x128) == 3) {
        peVar15 = std::
                  __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d4c03);
        iVar3 = (int)((ulong)in_stack_fffffffffffffa48 >> 0x20);
        strfmt<200>::strfmt(&local_108,
                            "Receive AppendEntriesRequest from another leader(%d) with same term, there must be a bug, server exits"
                           );
        msg_base::get_src(&local_18->super_msg_base);
        strfmt<200>::fmt<int>(in_stack_fffffffffffffa50,iVar3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   (char *)in_stack_fffffffffffffa88,(allocator<char> *)in_stack_fffffffffffffa80);
        (*peVar15->_vptr_logger[2])(peVar15,local_38);
        std::__cxx11::string::~string(local_38);
        std::allocator<char>::~allocator(&local_109);
        std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::
        operator->((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
                   0x1d4cc5);
        peVar9 = std::
                 __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d4ccd);
        (*peVar9->_vptr_state_mgr[8])(peVar9,0xffffffff);
        exit(-1);
      }
      restart_election_timer(in_stack_fffffffffffffa70);
    }
  }
  local_11d = 0;
  peVar7 = std::
           __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d4d5b);
  local_128 = srv_state::get_term(peVar7);
  local_12c = 4;
  local_130 = msg_base::get_src(&local_18->super_msg_base);
  peVar10 = std::
            __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d4db5);
  iVar3 = (*peVar10->_vptr_log_store[2])();
  local_138 = CONCAT44(extraout_var,iVar3);
  cs_new<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int,unsigned_long>
            ((unsigned_long *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (msg_type *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (int *)in_stack_fffffffffffffa50,(unsigned_long *)in_stack_fffffffffffffa48);
  uVar6 = req_msg::get_last_log_idx(local_18);
  local_3a1 = true;
  if (uVar6 != 0) {
    uVar6 = req_msg::get_last_log_idx(local_18);
    peVar10 = std::
              __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d4e5b);
    iVar3 = (*peVar10->_vptr_log_store[2])();
    local_3b9 = false;
    if (uVar6 < CONCAT44(extraout_var_00,iVar3)) {
      uVar6 = req_msg::get_last_log_term(local_18);
      req_msg::get_last_log_idx(local_18);
      uVar8 = term_for_log(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
      local_3b9 = uVar6 == uVar8;
    }
    local_3a1 = local_3b9;
  }
  local_139 = local_3a1;
  uVar6 = msg_base::get_term(&local_18->super_msg_base);
  peVar7 = std::
           __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d4f42);
  uVar8 = srv_state::get_term(peVar7);
  _Var18._M_pi = extraout_RDX;
  if ((uVar8 <= uVar6) && ((local_139 & 1U) != 0)) {
    pvVar11 = req_msg::log_entries(local_18);
    sVar12 = std::
             vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ::size(pvVar11);
    if (sVar12 != 0) {
      local_148 = req_msg::get_last_log_idx(local_18);
      local_150 = 0;
      while( true ) {
        local_148 = local_148 + 1;
        uVar2 = local_148;
        peVar10 = std::
                  __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d502d);
        iVar3 = (*peVar10->_vptr_log_store[2])();
        uVar1 = local_150;
        bVar19 = false;
        if (uVar2 < CONCAT44(extraout_var_01,iVar3)) {
          pvVar11 = req_msg::log_entries(local_18);
          sVar12 = std::
                   vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                   ::size(pvVar11);
          bVar19 = uVar1 < sVar12;
        }
        if (!bVar19) break;
        peVar10 = std::
                  __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d50d1);
        iVar3 = (*peVar10->_vptr_log_store[9])(peVar10,local_148);
        req_msg::log_entries(local_18);
        std::
        vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ::at((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
              *)in_stack_fffffffffffffa50,(size_type)in_stack_fffffffffffffa48);
        peVar14 = std::
                  __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d5132);
        uVar6 = log_entry::get_term(peVar14);
        if (CONCAT44(extraout_var_02,iVar3) != uVar6) break;
        local_150 = local_150 + 1;
      }
      while( true ) {
        uVar2 = local_148;
        peVar10 = std::
                  __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d51b0);
        iVar3 = (*peVar10->_vptr_log_store[2])();
        uVar1 = local_150;
        bVar19 = false;
        if (uVar2 < CONCAT44(extraout_var_03,iVar3)) {
          pvVar11 = req_msg::log_entries(local_18);
          sVar12 = std::
                   vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                   ::size(pvVar11);
          bVar19 = uVar1 < sVar12;
        }
        if (!bVar19) break;
        peVar10 = std::
                  __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d5254);
        (*peVar10->_vptr_log_store[8])(local_160,peVar10,local_148);
        peVar14 = std::
                  __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d527f);
        lVar4 = log_entry::get_val_type(peVar14);
        if (lVar4 == app_log) {
          peVar16 = std::
                    __shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d52b4);
          uVar1 = local_148;
          std::__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d52d9);
          pbVar13 = log_entry::get_buf(in_stack_fffffffffffffa60);
          peVar14 = std::
                    __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d52f8);
          puVar17 = log_entry::get_cookie(peVar14);
          (*peVar16->_vptr_state_machine[4])(peVar16,uVar1,pbVar13,puVar17);
        }
        else {
          peVar14 = std::
                    __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d5360);
          lVar4 = log_entry::get_val_type(peVar14);
          if (lVar4 == conf) {
            peVar15 = std::
                      __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d5395);
            strfmt<100>::strfmt(&local_1f0,"revert from a prev config change to config at %llu");
            this_00 = std::
                      __shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d53c7);
            cluster_config::get_log_idx(this_00);
            strfmt<100>::fmt<unsigned_long>
                      ((strfmt<100> *)in_stack_fffffffffffffa50,
                       (unsigned_long)in_stack_fffffffffffffa48);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                       (char *)in_stack_fffffffffffffa88,
                       (allocator<char> *)in_stack_fffffffffffffa80);
            (*peVar15->_vptr_logger[3])(peVar15,local_180);
            std::__cxx11::string::~string(local_180);
            std::allocator<char>::~allocator(&local_1f1);
            *(undefined1 *)(in_RSI + 0x29) = 0;
          }
        }
        req_msg::log_entries(local_18);
        std::
        vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ::at((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
              *)in_stack_fffffffffffffa50,(size_type)in_stack_fffffffffffffa48);
        std::shared_ptr<cornerstone::log_entry>::shared_ptr
                  ((shared_ptr<cornerstone::log_entry> *)in_stack_fffffffffffffa50,
                   in_stack_fffffffffffffa48);
        peVar10 = std::
                  __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d5521);
        (*peVar10->_vptr_log_store[6])(peVar10,local_148,local_208);
        peVar14 = std::
                  __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d554c);
        lVar4 = log_entry::get_val_type(peVar14);
        if (lVar4 == app_log) {
          peVar16 = std::
                    __shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d5581);
          uVar1 = local_148;
          std::__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d55a6);
          pbVar13 = log_entry::get_buf(in_stack_fffffffffffffa60);
          peVar14 = std::
                    __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d55c5);
          puVar17 = log_entry::get_cookie(peVar14);
          (*peVar16->_vptr_state_machine[3])(peVar16,uVar1,pbVar13,puVar17);
        }
        else {
          peVar14 = std::
                    __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d562d);
          lVar4 = log_entry::get_val_type(peVar14);
          if (lVar4 == conf) {
            peVar15 = std::
                      __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d5662);
            strfmt<100>::strfmt(&local_298,"receive a config change from leader at %llu");
            strfmt<100>::fmt<unsigned_long>
                      ((strfmt<100> *)in_stack_fffffffffffffa50,
                       (unsigned_long)in_stack_fffffffffffffa48);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                       (char *)in_stack_fffffffffffffa88,
                       (allocator<char> *)in_stack_fffffffffffffa80);
            (*peVar15->_vptr_logger[3])(peVar15,local_228);
            std::__cxx11::string::~string(local_228);
            std::allocator<char>::~allocator(&local_299);
            *(undefined1 *)(in_RSI + 0x29) = 1;
          }
        }
        local_148 = local_148 + 1;
        local_150 = local_150 + 1;
        std::shared_ptr<cornerstone::log_entry>::~shared_ptr
                  ((shared_ptr<cornerstone::log_entry> *)0x1d5793);
        std::shared_ptr<cornerstone::log_entry>::~shared_ptr
                  ((shared_ptr<cornerstone::log_entry> *)0x1d57a0);
      }
      while( true ) {
        uVar1 = local_150;
        pvVar11 = req_msg::log_entries(local_18);
        sVar12 = std::
                 vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ::size(pvVar11);
        if (sVar12 <= uVar1) break;
        req_msg::log_entries(local_18);
        local_150 = local_150 + 1;
        std::
        vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ::at((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
              *)in_stack_fffffffffffffa50,(size_type)in_stack_fffffffffffffa48);
        std::shared_ptr<cornerstone::log_entry>::shared_ptr
                  ((shared_ptr<cornerstone::log_entry> *)in_stack_fffffffffffffa50,
                   in_stack_fffffffffffffa48);
        peVar10 = std::
                  __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d5880);
        iVar3 = (*peVar10->_vptr_log_store[5])(peVar10,local_2b0);
        local_2b8 = (raft_server *)CONCAT44(extraout_var_04,iVar3);
        peVar14 = std::
                  __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d58b2);
        lVar4 = log_entry::get_val_type(peVar14);
        if (lVar4 == conf) {
          peVar15 = std::
                    __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d58e1);
          strfmt<100>::strfmt(&local_348,"receive a config change from leader at %llu");
          strfmt<100>::fmt<unsigned_long>
                    ((strfmt<100> *)in_stack_fffffffffffffa50,
                     (unsigned_long)in_stack_fffffffffffffa48);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                     (char *)in_stack_fffffffffffffa88,(allocator<char> *)in_stack_fffffffffffffa80)
          ;
          (*peVar15->_vptr_logger[3])(peVar15,local_2d8);
          std::__cxx11::string::~string(local_2d8);
          std::allocator<char>::~allocator(&local_349);
          *(undefined1 *)(in_RSI + 0x29) = 1;
        }
        else {
          peVar14 = std::
                    __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1d59f5);
          in_stack_fffffffffffffa94 = log_entry::get_val_type(peVar14);
          if (in_stack_fffffffffffffa94 == app_log) {
            peVar16 = std::
                      __shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d5a20);
            in_stack_fffffffffffffa80 = local_2b8;
            std::
            __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d5a3f);
            in_stack_fffffffffffffa88 = log_entry::get_buf(in_stack_fffffffffffffa60);
            peVar14 = std::
                      __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d5a5b);
            puVar17 = log_entry::get_cookie(peVar14);
            (*peVar16->_vptr_state_machine[3])
                      (peVar16,in_stack_fffffffffffffa80,in_stack_fffffffffffffa88,puVar17);
          }
        }
        std::shared_ptr<cornerstone::log_entry>::~shared_ptr
                  ((shared_ptr<cornerstone::log_entry> *)0x1d5a9a);
      }
    }
    iVar5 = msg_base::get_src(&local_18->super_msg_base);
    *(int32 *)(in_RSI + 8) = iVar5;
    req_msg::get_commit_idx(local_18);
    commit((raft_server *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
           (ulong)in_stack_fffffffffffffa88);
    this_01 = std::
              __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d5b0a);
    uVar6 = req_msg::get_last_log_idx(local_18);
    iVar3 = (int)uVar6;
    pvVar11 = req_msg::log_entries(local_18);
    __addr_len = (socklen_t *)
                 std::
                 vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ::size(pvVar11);
    resp_msg::accept(this_01,iVar3 + 1 + (int)__addr_len,__addr,__addr_len);
    _Var18._M_pi = extraout_RDX_00;
  }
  pVar20.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var18._M_pi;
  pVar20.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar20.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_append_entries(req_msg& req)
{
    if (req.get_term() == state_->get_term())
    {
        if (role_ == srv_role::candidate)
        {
            become_follower();
        }
        else if (role_ == srv_role::leader)
        {
            l_->debug(lstrfmt("Receive AppendEntriesRequest from another leader(%d) with same term, there must be a "
                              "bug, server exits")
                          .fmt(req.get_src()));
            ctx_->state_mgr_->system_exit(-1);
            ::exit(-1);
        }
        else
        {
            restart_election_timer();
        }
    }

    // After a snapshot the req.get_last_log_idx() may less than log_store_->next_slot() but equals to
    // log_store_->next_slot() -1 In this case, log is Okay if req.get_last_log_idx() == lastSnapshot.get_last_log_idx()
    // && req.get_last_log_term() == lastSnapshot.get_last_log_term() In not accepted case, we will return
    // log_store_->next_slot() for the leader to quick jump to the index that might aligned
    ptr<resp_msg> resp(cs_new<resp_msg>(
        state_->get_term(), msg_type::append_entries_response, id_, req.get_src(), log_store_->next_slot()));
    bool log_okay = req.get_last_log_idx() == 0 || (req.get_last_log_idx() < log_store_->next_slot() &&
                                                    req.get_last_log_term() == term_for_log(req.get_last_log_idx()));
    if (req.get_term() < state_->get_term() || !log_okay)
    {
        return resp;
    }

    // follower & log is okay
    if (req.log_entries().size() > 0)
    {
        // write logs to store, start from overlapped logs
        ulong idx = req.get_last_log_idx() + 1;
        size_t log_idx = 0;
        while (idx < log_store_->next_slot() && log_idx < req.log_entries().size())
        {
            if (log_store_->term_at(idx) == req.log_entries().at(log_idx)->get_term())
            {
                idx++;
                log_idx++;
            }
            else
            {
                break;
            }
        }

        // dealing with overwrites
        while (idx < log_store_->next_slot() && log_idx < req.log_entries().size())
        {
            ptr<log_entry> old_entry(log_store_->entry_at(idx));
            if (old_entry->get_val_type() == log_val_type::app_log)
            {
                state_machine_->rollback(idx, old_entry->get_buf(), old_entry->get_cookie());
            }
            else if (old_entry->get_val_type() == log_val_type::conf)
            {
                l_->info(sstrfmt("revert from a prev config change to config at %llu").fmt(config_->get_log_idx()));
                config_changing_ = false;
            }

            ptr<log_entry> entry = req.log_entries().at(log_idx);
            log_store_->write_at(idx, entry);
            if (entry->get_val_type() == log_val_type::app_log)
            {
                state_machine_->pre_commit(idx, entry->get_buf(), entry->get_cookie());
            }
            else if (entry->get_val_type() == log_val_type::conf)
            {
                l_->info(sstrfmt("receive a config change from leader at %llu").fmt(idx));
                config_changing_ = true;
            }

            idx += 1;
            log_idx += 1;
        }

        // append new log entries
        while (log_idx < req.log_entries().size())
        {
            ptr<log_entry> entry = req.log_entries().at(log_idx++);
            ulong idx_for_entry = log_store_->append(entry);
            if (entry->get_val_type() == log_val_type::conf)
            {
                l_->info(sstrfmt("receive a config change from leader at %llu").fmt(idx_for_entry));
                config_changing_ = true;
            }
            else if (entry->get_val_type() == log_val_type::app_log)
            {
                state_machine_->pre_commit(idx_for_entry, entry->get_buf(), entry->get_cookie());
            }
        }
    }

    leader_ = req.get_src();
    commit(req.get_commit_idx());
    resp->accept(req.get_last_log_idx() + req.log_entries().size() + 1);
    return resp;
}